

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O0

void __thiscall duckdb::ColumnData::SetStart(ColumnData *this,idx_t new_start)

{
  bool bVar1;
  ColumnSegment *this_00;
  __int_type _Var2;
  undefined8 in_RSI;
  SegmentTree<duckdb::ColumnSegment,_false> *in_RDI;
  SegmentIterator SVar3;
  ColumnSegment *segment;
  SegmentIterator __end1;
  SegmentIterator __begin1;
  SegmentIterationHelper *__range1;
  idx_t offset;
  SegmentIterationHelper *in_stack_ffffffffffffffb0;
  SegmentIterator local_38;
  SegmentTree<duckdb::ColumnSegment,_false> *local_28;
  SegmentTree<duckdb::ColumnSegment,_false> **local_20;
  long local_18;
  
  *(undefined8 *)&in_RDI->finished_loading = in_RSI;
  local_18 = 0;
  local_28 = (SegmentTree<duckdb::ColumnSegment,_false> *)
             SegmentTree<duckdb::ColumnSegment,_false>::Segments(in_RDI);
  local_20 = &local_28;
  local_38 = SegmentTree<duckdb::ColumnSegment,_false>::SegmentIterationHelper::begin
                       (in_stack_ffffffffffffffb0);
  SVar3 = SegmentTree<duckdb::ColumnSegment,_false>::SegmentIterationHelper::end
                    ((SegmentIterationHelper *)0xb8d49f);
  while( true ) {
    bVar1 = SegmentTree<duckdb::ColumnSegment,_false>::SegmentIterationHelper::SegmentIterator::
            operator!=(&local_38,(SegmentIterator *)&stack0xffffffffffffffb8);
    if (!bVar1) break;
    this_00 = SegmentTree<duckdb::ColumnSegment,_false>::SegmentIterationHelper::SegmentIterator::
              operator*(&local_38);
    (this_00->super_SegmentBase<duckdb::ColumnSegment>).start =
         *(long *)&in_RDI->finished_loading + local_18;
    _Var2 = ::std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)SVar3.tree);
    local_18 = _Var2 + local_18;
    SegmentTree<duckdb::ColumnSegment,_false>::SegmentIterationHelper::SegmentIterator::operator++
              ((SegmentIterator *)this_00);
  }
  SegmentTree<duckdb::ColumnSegment,_false>::Reinitialize(__begin1.tree);
  return;
}

Assistant:

void ColumnData::SetStart(idx_t new_start) {
	this->start = new_start;
	idx_t offset = 0;
	for (auto &segment : data.Segments()) {
		segment.start = start + offset;
		offset += segment.count;
	}
	data.Reinitialize();
}